

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<unsigned_int,_void> * __thiscall
pstore::maybe<unsigned_int,void>::operator=(maybe<unsigned_int,void> *this,uint *other)

{
  uint uVar1;
  uint *puVar2;
  
  if (*this == (maybe<unsigned_int,void>)0x1) {
    uVar1 = *other;
    puVar2 = value_impl<pstore::maybe<unsigned_int,void>&,unsigned_int>
                       ((maybe<unsigned_int,_void> *)this);
    *puVar2 = uVar1;
  }
  else {
    *(uint *)(this + 4) = *other;
    *this = (maybe<unsigned_int,void>)0x1;
  }
  return (maybe<unsigned_int,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }